

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InertiaNonLinearParametrization.cpp
# Opt level: O0

Matrix<double,_9,_1,_0,_9,_1> * iDynTree::vecColMajor(Matrix<double,_3,_3,_1,_3,_3> *mat)

{
  double dVar1;
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  Matrix<double,_9,_1,_0,_9,_1> *in_RDI;
  Matrix<double,_9,_1,_0,_9,_1> *vec;
  Index in_stack_ffffffffffffff98;
  double index;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *in_stack_ffffffffffffffa0;
  DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1> *this;
  
  Eigen::Matrix<double,_9,_1,_0,_9,_1>::Matrix((Matrix<double,_9,_1,_0,_9,_1> *)0x6a0f90);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x6a0fa1);
  index = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1> *)
                      in_stack_ffffffffffffffa0,(Index)index);
  *pSVar3 = index;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     (in_stack_ffffffffffffffa0,(Index)index,0x6a0fd4);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1> *)*pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator()
                     (this,(Index)index);
  *pSVar3 = (Scalar)this;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)this,(Index)index,
                      0x6a100a);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator()
                     (this,(Index)index);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)this,(Index)index,
                      0x6a1040);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator()
                     (this,(Index)index);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)this,(Index)index,
                      0x6a1075);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator()
                     (this,(Index)index);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)this,(Index)index,
                      0x6a10ac);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator()
                     (this,(Index)index);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)this,(Index)index,
                      0x6a10e2);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator()
                     (this,(Index)index);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)this,(Index)index,
                      0x6a1119);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator()
                     (this,(Index)index);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)this,(Index)index,
                      0x6a114e);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_1>::operator()
                     (this,(Index)index);
  *pSVar3 = dVar1;
  return in_RDI;
}

Assistant:

Eigen::Matrix<double, 9, 1> vecColMajor(const Eigen::Matrix<double, 3, 3, Eigen::RowMajor> & mat)
{
    Eigen::Matrix<double, 9, 1> vec;

    vec(0) = mat(0,0);
    vec(1) = mat(1,0);
    vec(2) = mat(2,0);
    vec(3) = mat(0,1);
    vec(4) = mat(1,1);
    vec(5) = mat(2,1);
    vec(6) = mat(0,2);
    vec(7) = mat(1,2);
    vec(8) = mat(2,2);

    return vec;
}